

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_util.cpp
# Opt level: O2

void __thiscall TaprootUtil_Bip86_1_Test::TestBody(TaprootUtil_Bip86_1_Test *this)

{
  char *pcVar1;
  AssertionResult gtest_ar_3;
  AssertHelper local_1b0;
  AssertionResult gtest_ar;
  SchnorrPubkey output_key;
  ByteData ctrl;
  TapBranch branch_elements;
  SchnorrPubkey pk;
  Script locking_script;
  TapBranch branch;
  
  std::__cxx11::string::string
            ((string *)&branch,"83dfe85a3151d2517290da461fe2815591ef69f2b18a2ce63f01697a8b313145",
             (allocator *)&branch_elements);
  cfd::core::SchnorrPubkey::SchnorrPubkey(&pk,(string *)&branch);
  std::__cxx11::string::~string((string *)&branch);
  cfd::core::TapBranch::TapBranch(&branch);
  cfd::core::SchnorrPubkey::SchnorrPubkey(&output_key);
  cfd::core::Script::Script(&locking_script);
  cfd::core::TaprootUtil::CreateTapScriptControl(&ctrl,&pk,&branch,&output_key,&locking_script);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_((string *)&branch_elements,&output_key);
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&gtest_ar,
             "\"a82f29944d65b86ae6b5e5cc75e294ead6c59391a1edc5e016e3498c67fc7bbb\"",
             "output_key.GetHex()",(char (*) [65])0x473037,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&branch_elements);
  std::__cxx11::string::~string((string *)&branch_elements);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&branch_elements);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x1df,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_3,(Message *)&branch_elements);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&branch_elements);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&branch_elements,&locking_script);
  testing::internal::CmpHelperEQ<char[69],std::__cxx11::string>
            ((internal *)&gtest_ar,
             "\"5120a82f29944d65b86ae6b5e5cc75e294ead6c59391a1edc5e016e3498c67fc7bbb\"",
             "locking_script.GetHex()",
             (char (*) [69])"5120a82f29944d65b86ae6b5e5cc75e294ead6c59391a1edc5e016e3498c67fc7bbb",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&branch_elements);
  std::__cxx11::string::~string((string *)&branch_elements);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&branch_elements);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x1e1,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_3,(Message *)&branch_elements);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&branch_elements);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&branch_elements,&ctrl);
  testing::internal::CmpHelperEQ<char[67],std::__cxx11::string>
            ((internal *)&gtest_ar,
             "\"c083dfe85a3151d2517290da461fe2815591ef69f2b18a2ce63f01697a8b313145\"",
             "ctrl.GetHex()",
             (char (*) [67])"c083dfe85a3151d2517290da461fe2815591ef69f2b18a2ce63f01697a8b313145",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&branch_elements);
  std::__cxx11::string::~string((string *)&branch_elements);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&branch_elements);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x1e3,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_3,(Message *)&branch_elements);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&branch_elements);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::TapBranch::TapBranch(&branch_elements,kElementsRegtest);
  cfd::core::TaprootUtil::CreateTapScriptControl
            ((ByteData *)&gtest_ar,&pk,&branch_elements,&output_key,&locking_script);
  cfd::core::ByteData::operator=(&ctrl,(ByteData *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_((string *)&gtest_ar,&output_key);
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&gtest_ar_3,
             "\"c73ac1b7a518499b9642aed8cfa15d5401e5bd85ad760b937b69521c297722f0\"",
             "output_key.GetHex()",(char (*) [65])0x492baa,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x1ea,pcVar1);
    testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&gtest_ar,&locking_script);
  testing::internal::CmpHelperEQ<char[69],std::__cxx11::string>
            ((internal *)&gtest_ar_3,
             "\"5120c73ac1b7a518499b9642aed8cfa15d5401e5bd85ad760b937b69521c297722f0\"",
             "locking_script.GetHex()",
             (char (*) [69])"5120c73ac1b7a518499b9642aed8cfa15d5401e5bd85ad760b937b69521c297722f0",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x1ec,pcVar1);
    testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar,&ctrl);
  testing::internal::CmpHelperEQ<char[67],std::__cxx11::string>
            ((internal *)&gtest_ar_3,
             "\"c583dfe85a3151d2517290da461fe2815591ef69f2b18a2ce63f01697a8b313145\"",
             "ctrl.GetHex()",
             (char (*) [67])"c583dfe85a3151d2517290da461fe2815591ef69f2b18a2ce63f01697a8b313145",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x1ee,pcVar1);
    testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  cfd::core::TapBranch::~TapBranch(&branch_elements);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&ctrl);
  cfd::core::Script::~Script(&locking_script);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&output_key);
  cfd::core::TapBranch::~TapBranch(&branch);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk);
  return;
}

Assistant:

TEST(TaprootUtil, Bip86_1) {
  // https://github.com/bitcoin/bips/blob/master/bip-0086.mediawiki
  // Account 0, second receiving address = m/86'/0'/0'/0/1
  // xprv         = xprvA449goEeU9okyiF1LmKiDaTgeXvmh87DVyRd35VPbsSop8n8uALpbtrUhUXByPFKK7C2yuqrB1FrhiDkEMC4RGmA5KTwsE1aB5jRu9zHsuQ
  // xpub         = xpub6H3W6JmYJXN4CCKUSnriaiQRCZmG6aq4sCMDqTu1ACyngw7HShf59hAxYjXgKDuuHThVEUzdHrc3aXCr9kfvQvZPit5dnD3K9xVRBzjK3rX
  // internal_key = 83dfe85a3151d2517290da461fe2815591ef69f2b18a2ce63f01697a8b313145
  // output_key   = a82f29944d65b86ae6b5e5cc75e294ead6c59391a1edc5e016e3498c67fc7bbb
  // scriptPubKey = 5120a82f29944d65b86ae6b5e5cc75e294ead6c59391a1edc5e016e3498c67fc7bbb
  // address      = bc1p4qhjn9zdvkux4e44uhx8tc55attvtyu358kutcqkudyccelu0was9fqzwh
  SchnorrPubkey pk("83dfe85a3151d2517290da461fe2815591ef69f2b18a2ce63f01697a8b313145");
  TapBranch branch;

  SchnorrPubkey output_key;
  Script locking_script;
  auto ctrl = TaprootUtil::CreateTapScriptControl(
    pk, branch, &output_key, &locking_script);
  EXPECT_EQ("a82f29944d65b86ae6b5e5cc75e294ead6c59391a1edc5e016e3498c67fc7bbb",
      output_key.GetHex());
  EXPECT_EQ("5120a82f29944d65b86ae6b5e5cc75e294ead6c59391a1edc5e016e3498c67fc7bbb",
      locking_script.GetHex());
  EXPECT_EQ("c083dfe85a3151d2517290da461fe2815591ef69f2b18a2ce63f01697a8b313145",
      ctrl.GetHex());
  
  // for elements
  TapBranch branch_elements(NetType::kElementsRegtest);
  ctrl = TaprootUtil::CreateTapScriptControl(
    pk, branch_elements, &output_key, &locking_script);
  EXPECT_EQ("c73ac1b7a518499b9642aed8cfa15d5401e5bd85ad760b937b69521c297722f0",
      output_key.GetHex());
  EXPECT_EQ("5120c73ac1b7a518499b9642aed8cfa15d5401e5bd85ad760b937b69521c297722f0",
      locking_script.GetHex());
  EXPECT_EQ("c583dfe85a3151d2517290da461fe2815591ef69f2b18a2ce63f01697a8b313145",
      ctrl.GetHex());
}